

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

void __thiscall celero::Archive::Impl::readExistingResults(Impl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long lVar4;
  ArchiveEntry r;
  ifstream is;
  ArchiveEntry local_398;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((string *)local_238);
  std::ifstream::open((string *)local_238,(int)this + (_S_out|_S_in));
  cVar3 = std::__basic_file<char>::is_open();
  if ((cVar3 != '\0') && (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0)) {
    std::istream::ignore((long)local_238,-1);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      paVar1 = &local_398.GroupName.field_2;
      paVar2 = &local_398.RunName.field_2;
      do {
        lVar4 = std::istream::tellg();
        if (lVar4 < 0) break;
        local_398.GroupName._M_string_length = 0;
        local_398.GroupName.field_2._M_local_buf[0] = '\0';
        local_398.RunName._M_string_length = 0;
        local_398.RunName.field_2._M_local_buf[0] = '\0';
        local_398.FirstRanDate._0_4_ = 0;
        local_398._84_8_ = 0;
        local_398.ExperimentValue = 0;
        local_398.ExperimentValueScale._0_4_ = 0;
        local_398.ExperimentValueScale._4_4_ = 0;
        local_398.GroupName._M_dataplus._M_p = (pointer)paVar1;
        local_398.RunName._M_dataplus._M_p = (pointer)paVar2;
        memset(&local_398.AverageBaseline,0,0xf9);
        operator>>((istream *)local_238,&local_398);
        if (local_398.GroupName._M_string_length != 0) {
          std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>::push_back
                    (&this->results,&local_398);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.RunName._M_dataplus._M_p != paVar2) {
          operator_delete(local_398.RunName._M_dataplus._M_p,
                          CONCAT71(local_398.RunName.field_2._M_allocated_capacity._1_7_,
                                   local_398.RunName.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.GroupName._M_dataplus._M_p != paVar1) {
          operator_delete(local_398.GroupName._M_dataplus._M_p,
                          CONCAT71(local_398.GroupName.field_2._M_allocated_capacity._1_7_,
                                   local_398.GroupName.field_2._M_local_buf[0]) + 1);
        }
      } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void readExistingResults()
	{
		// Read in existing results?
		std::ifstream is;
		is.open(this->fileName, std::fstream::in);

		if((is.is_open() == true) && (is.good() == true) && (is.fail() == false))
		{
			// Throw away the header.
			is.ignore(std::numeric_limits<std::streamsize>::max(), '\n');

			// Read in existing results.
			while((is.eof() == false) && (is.tellg() >= 0))
			{
				ArchiveEntry r;
				is >> r;

				if(r.GroupName.empty() == false)
				{
					this->results.push_back(r);
				}
			}

			// Close the file for reading.
			is.close();
		}
	}